

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O0

int ExtractMetadata(uint8_t *data,size_t data_size,Metadata *metadata)

{
  uint32_t chunk_num;
  int iVar1;
  WebPDemuxer *dmux;
  uint32_t flags;
  WebPChunkIterator chunk_iter;
  WebPDemuxer *demux;
  WebPData webp_data;
  undefined4 in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  WebPDemuxer *in_stack_ffffffffffffff98;
  WebPDemuxer *in_stack_ffffffffffffffa0;
  int local_4;
  
  dmux = WebPDemux((WebPData *)0x10d7c1);
  if (dmux == (WebPDemuxer *)0x0) {
    local_4 = 0;
  }
  else {
    chunk_num = WebPDemuxGetI(dmux,WEBP_FF_FORMAT_FLAGS);
    if ((chunk_num & 0x20) != 0) {
      iVar1 = WebPDemuxGetChunk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,chunk_num,
                                (WebPChunkIterator *)0x10d812);
      if (iVar1 != 0) {
        MetadataCopy((char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                     (MetadataPayload *)CONCAT44(chunk_num,in_stack_ffffffffffffff88));
        WebPDemuxReleaseChunkIterator((WebPChunkIterator *)&stack0xffffffffffffff90);
      }
    }
    if ((chunk_num & 8) != 0) {
      iVar1 = WebPDemuxGetChunk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,chunk_num,
                                (WebPChunkIterator *)0x10d860);
      if (iVar1 != 0) {
        MetadataCopy((char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                     (MetadataPayload *)CONCAT44(chunk_num,in_stack_ffffffffffffff88));
        WebPDemuxReleaseChunkIterator((WebPChunkIterator *)&stack0xffffffffffffff90);
      }
    }
    if ((chunk_num & 4) != 0) {
      iVar1 = WebPDemuxGetChunk(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,chunk_num,
                                (WebPChunkIterator *)0x10d8aa);
      if (iVar1 != 0) {
        MetadataCopy((char *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90,
                     (MetadataPayload *)CONCAT44(chunk_num,in_stack_ffffffffffffff88));
        WebPDemuxReleaseChunkIterator((WebPChunkIterator *)&stack0xffffffffffffff90);
      }
    }
    WebPDemuxDelete(in_stack_ffffffffffffffa0);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int ExtractMetadata(const uint8_t* const data, size_t data_size,
                           Metadata* const metadata) {
  WebPData webp_data = { data, data_size };
  WebPDemuxer* const demux = WebPDemux(&webp_data);
  WebPChunkIterator chunk_iter;
  uint32_t flags;

  if (demux == NULL) return 0;
  assert(metadata != NULL);

  flags = WebPDemuxGetI(demux, WEBP_FF_FORMAT_FLAGS);

  if ((flags & ICCP_FLAG) && WebPDemuxGetChunk(demux, "ICCP", 1, &chunk_iter)) {
    MetadataCopy((const char*)chunk_iter.chunk.bytes, chunk_iter.chunk.size,
                 &metadata->iccp);
    WebPDemuxReleaseChunkIterator(&chunk_iter);
  }
  if ((flags & EXIF_FLAG) && WebPDemuxGetChunk(demux, "EXIF", 1, &chunk_iter)) {
    MetadataCopy((const char*)chunk_iter.chunk.bytes, chunk_iter.chunk.size,
                 &metadata->exif);
    WebPDemuxReleaseChunkIterator(&chunk_iter);
  }
  if ((flags & XMP_FLAG) && WebPDemuxGetChunk(demux, "XMP ", 1, &chunk_iter)) {
    MetadataCopy((const char*)chunk_iter.chunk.bytes, chunk_iter.chunk.size,
                 &metadata->xmp);
    WebPDemuxReleaseChunkIterator(&chunk_iter);
  }
  WebPDemuxDelete(demux);
  return 1;
}